

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O0

bool __thiscall
mprpc::MpRpcServer::notify(MpRpcServer *this,string *conn_id,char *method,void *data,size_t size)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  pointer ppVar4;
  ssize_t sVar5;
  int __flags;
  shared_ptr<mprpc::ClientConnection> local_b0;
  shared_ptr<mprpc::ClientConnection> local_a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_true>
  local_90;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_true>
  local_88;
  iterator it;
  unique_lock<std::recursive_mutex> lock;
  undefined1 local_60 [8];
  MsgPackPacker pk;
  size_t size_local;
  void *data_local;
  char *method_local;
  string *conn_id_local;
  MpRpcServer *this_local;
  
  __flags = (int)size;
  pk.pk.callback = (msgpack_packer_write)size;
  MsgPackPacker::MsgPackPacker((MsgPackPacker *)local_60);
  MsgPackPacker::pack_map((MsgPackPacker *)local_60,3);
  MsgPackPacker::pack_map_item((MsgPackPacker *)local_60,"id",0);
  MsgPackPacker::pack_map_item((MsgPackPacker *)local_60,"method",method);
  MsgPackPacker::pack_string((MsgPackPacker *)local_60,"params",0);
  msgpack_pack_str_body((msgpack_packer *)&pk.sb.alloc,data,(size_t)pk.pk.callback);
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)&it,(mutex_type *)(this + 8));
  local_88._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>_>
                *)(this + 0x30));
  do {
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>_>_>
                *)(this + 0x30));
    bVar1 = std::__detail::operator!=(&local_88,&local_90);
    if (!bVar1) {
      this_local._7_1_ = true;
LAB_001cbfc0:
      std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&it)
      ;
      MsgPackPacker::~MsgPackPacker((MsgPackPacker *)local_60);
      return this_local._7_1_;
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_false,_true>
                             *)&local_88);
      _Var2 = std::operator==(conn_id,&ppVar4->first);
      if (_Var2) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_false,_true>
                               *)&local_88);
        std::shared_ptr<mprpc::ClientConnection>::shared_ptr(&local_b0,&ppVar4->second);
        sVar5 = send(this,(int)&local_b0,(void *)pk.sb.size,(size_t)local_60,__flags);
        this_local._7_1_ = (bool)((byte)sVar5 & 1);
        std::shared_ptr<mprpc::ClientConnection>::~shared_ptr(&local_b0);
        goto LAB_001cbfc0;
      }
    }
    else {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_false,_true>
                             *)&local_88);
      std::shared_ptr<mprpc::ClientConnection>::shared_ptr(&local_a0,&ppVar4->second);
      send(this,(int)&local_a0,(void *)pk.sb.size,(size_t)local_60,__flags);
      std::shared_ptr<mprpc::ClientConnection>::~shared_ptr(&local_a0);
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mprpc::ClientConnection>_>,_false,_true>
                  *)&local_88,0);
  } while( true );
}

Assistant:

bool MpRpcServer::notify(const string& conn_id, const char* method, const void* data, size_t size)
    {
        MsgPackPacker pk;
        pk.pack_map(3);

        pk.pack_map_item("id", 0);
        pk.pack_map_item("method", method);
        pk.pack_string("params");
        msgpack_pack_str_body(&pk.pk, data, size);

        unique_lock<recursive_mutex> lock(m_conn_map_lock);

        for (auto it = m_conn_map.begin(); it != m_conn_map.end(); it++) {
            if (conn_id.empty()) {
                send(it->second, pk.sb.data, pk.sb.size);
            }
            else if (conn_id == it->first) {
                return send(it->second, pk.sb.data, pk.sb.size);
            }
        }
        return true;
    }